

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

bool __thiscall Reducer::tryToReplaceCurrent(Reducer *this,Expression *with)

{
  PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_> *this_00;
  Expression *expression;
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  string local_48;
  
  if ((((this->deNan != true) || (with->_id != ConstId)) ||
      (cVar1 = wasm::Literal::isNaN(), cVar1 == '\0')) &&
     (expression = *(this->
                    super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                    ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                    super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.replacep,
     (expression->type).id == (with->type).id)) {
    uVar3 = this->decisionCounter + 1;
    this->decisionCounter = uVar3;
    if (1 < uVar3 % (ulong)(long)this->factor) {
      return false;
    }
    this_00 = &(this->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
              (&this_00->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,with)
    ;
    bVar2 = writeAndTestReduction(this);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|      tryToReplaceCurrent succeeded (in ",0x29);
      getLocation_abi_cxx11_(&local_48,this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this->reduced = this->reduced + 1;
      applyTestToWorking(this);
      return true;
    }
    wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
              (&this_00->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               expression);
  }
  return false;
}

Assistant:

bool tryToReplaceCurrent(Expression* with) {
    if (!isOkReplacement(with)) {
      return false;
    }
    auto* curr = getCurrent();
    // std::cerr << "try " << curr << " => " << with << '\n';
    if (curr->type != with->type) {
      return false;
    }
    if (!shouldTryToReduce()) {
      return false;
    }
    replaceCurrent(with);
    if (!writeAndTestReduction()) {
      replaceCurrent(curr);
      return false;
    }
    std::cerr << "|      tryToReplaceCurrent succeeded (in " << getLocation()
              << ")\n";
    noteReduction();
    return true;
  }